

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

string * __thiscall
(anonymous_namespace)::ConstPubkeyProvider::ToString_abi_cxx11_
          (string *__return_storage_ptr__,void *this,StringType type)

{
  byte bVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)((long)this + 0x4d) == '\x01') {
    s.m_data = (uchar *)((long)this + 0xc);
    sVar2 = 0x21;
    if ((*(byte *)((long)this + 0xc) & 0xfe) != 2) {
      bVar1 = *(byte *)((long)this + 0xc) - 4;
      if (bVar1 < 4) {
        sVar2 = *(size_t *)(&DAT_002539b8 + (ulong)bVar1 * 8);
      }
      else {
        sVar2 = 0;
      }
    }
    s.m_size = sVar2;
    HexStr_abi_cxx11_(&local_38,s);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (__return_storage_ptr__,&local_38,2,0xffffffffffffffff);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return __return_storage_ptr__;
    }
  }
  else {
    sVar2 = 0x21;
    if ((*(byte *)((long)this + 0xc) & 0xfe) != 2) {
      bVar1 = *(byte *)((long)this + 0xc) - 4;
      if (bVar1 < 4) {
        sVar2 = *(size_t *)(&DAT_002539b8 + (ulong)bVar1 * 8);
      }
      else {
        sVar2 = 0;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      s_00.m_data = (uchar *)((long)this + 0xc);
      s_00.m_size = sVar2;
      HexStr_abi_cxx11_(__return_storage_ptr__,s_00);
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

std::string ToString(StringType type) const override { return m_xonly ? HexStr(m_pubkey).substr(2) : HexStr(m_pubkey); }